

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

QCborValue * __thiscall
QJsonPrivate::Parser::parse(QCborValue *__return_storage_ptr__,Parser *this,QJsonParseError *error)

{
  QExplicitlySharedDataPointer<QCborContainerPrivate> *this_00;
  ParseError PVar1;
  Type TVar2;
  bool bVar3;
  QCborContainerPrivate *pQVar4;
  long in_FS_OFFSET;
  QCborValue result;
  qint64 local_48;
  QCborContainerPrivate *pQStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  eatBOM(this);
  local_48 = 0;
  pQStack_40 = (QCborContainerPrivate *)0x0;
  local_38 = 0xaaaaaaaa00000117;
  bVar3 = eatSpace(this);
  if (bVar3) {
    if (*this->json == '\"') {
      pQVar4 = (QCborContainerPrivate *)operator_new(0x40);
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      pQVar4->usedData = 0;
      (pQVar4->data).d.d = (Data *)0x0;
      (pQVar4->data).d.ptr = (char *)0x0;
      (pQVar4->data).d.size = 0;
      (pQVar4->elements).d.d = (Data *)0x0;
      (pQVar4->elements).d.ptr = (Element *)0x0;
      (pQVar4->elements).d.size = 0;
      this_00 = &this->container;
      QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(this_00,pQVar4);
      this->json = this->json + 1;
      bVar3 = parseString(this);
      if (bVar3) {
        result.container = (this_00->d).ptr;
        (this_00->d).ptr = (QCborContainerPrivate *)0x0;
        result.t = String;
        result._20_4_ = 0xaaaaaaaa;
        result.n = 0;
        QCborValue::operator=((QCborValue *)&local_48,&result);
        QCborValue::~QCborValue((QCborValue *)&result);
LAB_002c55d1:
        eatSpace(this);
        pQVar4 = pQStack_40;
        if (this->end <= this->json) {
          if (error != (QJsonParseError *)0x0) {
            error->offset = 0;
            error->error = NoError;
          }
          __return_storage_ptr__->n = local_48;
          pQStack_40 = (QCborContainerPrivate *)0x0;
          __return_storage_ptr__->container = pQVar4;
          TVar2 = (Type)local_38;
          local_38 = CONCAT44(local_38._4_4_,0x117);
          __return_storage_ptr__->t = TVar2;
          goto LAB_002c5569;
        }
        PVar1 = GarbageAtEnd;
        goto LAB_002c5535;
      }
    }
    else {
      parseValue(&result,this);
      QCborValue::operator=((QCborValue *)&local_48,&result);
      QCborValue::~QCborValue((QCborValue *)&result);
      if ((Type)local_38 != 0x117) goto LAB_002c55d1;
    }
  }
  else {
    PVar1 = IllegalValue;
LAB_002c5535:
    this->lastError = PVar1;
  }
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
            (&this->container,(QCborContainerPrivate *)0x0);
  if (error != (QJsonParseError *)0x0) {
    error->offset = *(int *)&this->json - *(int *)&this->head;
    error->error = this->lastError;
  }
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
LAB_002c5569:
  QCborValue::~QCborValue((QCborValue *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue Parser::parse(QJsonParseError *error)
{
    eatBOM();

    char token;
    QCborValue value;

    if (!eatSpace()) {
        lastError = QJsonParseError::IllegalValue;
        goto error;
    }

    token = *json;
    if (token == Quote) {
        container = new QCborContainerPrivate;
        json++;
        if (!parseString())
            goto error;
        value = QCborContainerPrivate::makeValue(QCborValue::String, 0, container.take(),
                                                 QCborContainerPrivate::MoveContainer);
    } else {
        value = parseValue();
        if (value.isUndefined())
            goto error;
    }

    eatSpace();
    if (json < end) {
        lastError = QJsonParseError::GarbageAtEnd;
        goto error;
    }

    {
        if (error) {
            error->offset = 0;
            error->error = QJsonParseError::NoError;
        }

        return value;
    }

error:
    container.reset();
    if (error) {
        error->offset = json - head;
        error->error  = lastError;
    }
    return QCborValue();
}